

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O2

void stack_init(lua_State *L1,lua_State *L)

{
  undefined4 *puVar1;
  ulong uVar2;
  
  puVar1 = (undefined4 *)lj_mem_realloc(L,(void *)0x0,0,0x168);
  (L1->stack).ptr32 = (uint32_t)puVar1;
  L1->stacksize = 0x2d;
  (L1->maxstack).ptr32 = (uint32_t)puVar1 + 0x138;
  L1->top = (TValue *)(puVar1 + 2);
  L1->base = (TValue *)(puVar1 + 2);
  *puVar1 = (int)L1;
  puVar1[1] = 0xfffffff9;
  for (uVar2 = 0; uVar2 < 0x168; uVar2 = uVar2 + 8) {
    *(undefined4 *)((long)puVar1 + uVar2 + 4) = 0xffffffff;
  }
  return;
}

Assistant:

static void stack_init(lua_State *L1, lua_State *L)
{
  TValue *stend, *st = lj_mem_newvec(L, LJ_STACK_START+LJ_STACK_EXTRA, TValue);
  setmref(L1->stack, st);
  L1->stacksize = LJ_STACK_START + LJ_STACK_EXTRA;
  stend = st + L1->stacksize;
  setmref(L1->maxstack, stend - LJ_STACK_EXTRA - 1);
  L1->base = L1->top = st+1;
  setthreadV(L1, st, L1);  /* Needed for curr_funcisL() on empty stack. */
  while (st < stend)  /* Clear new slots. */
    setnilV(st++);
}